

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decode(codebook *book,oggpack_buffer *b)

{
  long lVar1;
  long lVar2;
  
  lVar2 = -1;
  if (0 < book->used_entries) {
    lVar1 = decode_packed_entry_number(book,b);
    if (-1 < lVar1) {
      lVar2 = (long)book->dec_index[lVar1];
    }
  }
  return lVar2;
}

Assistant:

long vorbis_book_decode(codebook *book, oggpack_buffer *b){
  if(book->used_entries>0){
    long packed_entry=decode_packed_entry_number(book,b);
    if(packed_entry>=0)
      return(book->dec_index[packed_entry]);
  }

  /* if there's no dec_index, the codebook unpacking isn't collapsed */
  return(-1);
}